

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void dec_alloc_cb_buf(AV1Decoder *pbi)

{
  int iVar1;
  void *pvVar2;
  long in_RDI;
  int size;
  size_t unaff_retaddr;
  AV1_COMMON *cm;
  
  iVar1 = ((*(int *)(in_RDI + 0x3d74) >>
           ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x9be8) + 0x24) & 0x1f)) + 1) *
          ((*(int *)(in_RDI + 0x3d78) >>
           ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x9be8) + 0x24) & 0x1f)) + 1);
  if (*(int *)(in_RDI + 0x5f6d8) < iVar1) {
    av1_dec_free_cb_buf((AV1Decoder *)0x1b0f0f);
    pvVar2 = aom_memalign((size_t)cm,unaff_retaddr);
    *(void **)(in_RDI + 0x5f6d0) = pvVar2;
    if (*(long *)(in_RDI + 0x5f6d0) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate pbi->cb_buffer_base");
    }
    memset(*(void **)(in_RDI + 0x5f6d0),0,(long)iVar1 * 0x3b000);
    *(int *)(in_RDI + 0x5f6d8) = iVar1;
  }
  return;
}

Assistant:

static inline void dec_alloc_cb_buf(AV1Decoder *pbi) {
  AV1_COMMON *const cm = &pbi->common;
  int size = ((cm->mi_params.mi_rows >> cm->seq_params->mib_size_log2) + 1) *
             ((cm->mi_params.mi_cols >> cm->seq_params->mib_size_log2) + 1);

  if (pbi->cb_buffer_alloc_size < size) {
    av1_dec_free_cb_buf(pbi);
    CHECK_MEM_ERROR(cm, pbi->cb_buffer_base,
                    aom_memalign(32, sizeof(*pbi->cb_buffer_base) * size));
    memset(pbi->cb_buffer_base, 0, sizeof(*pbi->cb_buffer_base) * size);
    pbi->cb_buffer_alloc_size = size;
  }
}